

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network_client.cpp
# Opt level: O0

int __thiscall CNetClient::Update(CNetClient *this)

{
  int iVar1;
  CNetClient *in_RDI;
  CNetTokenCache *in_stack_00000030;
  CNetConnection *in_stack_00000048;
  char *in_stack_ffffffffffffffe8;
  
  CNetConnection::Update(in_stack_00000048);
  iVar1 = CNetConnection::State(&in_RDI->m_Connection);
  if (iVar1 == 5) {
    CNetConnection::ErrorString(&in_RDI->m_Connection);
    Disconnect(in_RDI,in_stack_ffffffffffffffe8);
  }
  CNetTokenManager::Update((CNetTokenManager *)in_RDI);
  CNetTokenCache::Update(in_stack_00000030);
  return 0;
}

Assistant:

int CNetClient::Update()
{
	m_Connection.Update();
	if(m_Connection.State() == NET_CONNSTATE_ERROR)
		Disconnect(m_Connection.ErrorString());
	m_TokenManager.Update();
	m_TokenCache.Update();
	return 0;
}